

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::RandomOrderTexImage2DCase::createTexture(RandomOrderTexImage2DCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  int level;
  int internalFormat;
  deUint32 type;
  deUint32 dVar3;
  byte bVar4;
  long lVar5;
  int width;
  int height;
  int ndx;
  long lVar6;
  float fVar7;
  deUint32 tex;
  vector<int,_std::allocator<int>_> levels;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  TextureLevel levelData;
  PixelBufferAccess local_58;
  
  tex = 0;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  dVar3 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  std::vector<int,_std::allocator<int>_>::vector
            (&levels,(long)(this->super_Texture2DSpecCase).m_numLevels,(allocator_type *)&local_58);
  if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
    lVar5 = 0;
    do {
      levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar5] = (int)lVar5;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_Texture2DSpecCase).m_numLevels);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
    lVar5 = 0;
    do {
      level = levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar5];
      bVar4 = (byte)level;
      width = (this->super_Texture2DSpecCase).m_width >> (bVar4 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height = (this->super_Texture2DSpecCase).m_height >> (bVar4 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar6 = 0;
      do {
        fVar1 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar6];
        fVar2 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[lVar6];
        fVar7 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar6] = (fVar2 - fVar1) * fVar7 + fVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar6 = 0;
      do {
        fVar1 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar6];
        fVar2 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[lVar6];
        fVar7 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar6] = (fVar2 - fVar1) * fVar7 + fVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      tcu::TextureLevel::setSize(&levelData,width,height,1);
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      internalFormat = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
      dVar3 = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,level,internalFormat,width,height,0,dVar3,type,
                 local_58.super_ConstPixelBufferAccess.m_data);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_Texture2DSpecCase).m_numLevels);
  }
  if (levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		vector<int>			levels		(m_numLevels);

		for (int i = 0; i < m_numLevels; i++)
			levels[i] = i;
		rnd.shuffle(levels.begin(), levels.end());

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelNdx	= levels[ndx];
			int		levelW		= de::max(1, m_width	>> levelNdx);
			int		levelH		= de::max(1, m_height	>> levelNdx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, levelNdx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}